

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-server.c
# Opt level: O2

int lws_context_init_server_ssl(lws_context_creation_info *info,lws_vhost *vhost)

{
  byte *pbVar1;
  lws_context *plVar2;
  lws *wsi;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  
  uVar4 = (uint)info->options;
  if ((uVar4 >> 0xc & 1) == 0) {
    (vhost->tls).use_ssl = 0;
    return 0;
  }
  plVar2 = vhost->context;
  wsi = plVar2->pt[0].fake_wsi;
  if ((info->ssl_cert_filepath != (char *)0x0) || (info->server_ssl_cert_mem != (void *)0x0)) {
    pbVar1 = (byte *)((long)&vhost->options + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  if (info->port == -1) goto LAB_0012708d;
  uVar3 = vhost->options;
  uVar4 = ((uint)uVar3 & 0x1000000) >> 0x18;
  (vhost->tls).use_ssl = uVar4;
  if ((uVar3 & 0x1000000) == 0) {
LAB_0012705c:
    pcVar6 = "";
    if (uVar4 == 0) {
      pcVar6 = "non-";
    }
  }
  else {
    if (info->ssl_cipher_list != (char *)0x0) {
      _lws_log(4," SSL ciphers: \'%s\'\n");
      uVar4 = (vhost->tls).use_ssl;
      goto LAB_0012705c;
    }
    pcVar6 = "";
  }
  _lws_log(4," Vhost \'%s\' using %sTLS mode\n",vhost->name,pcVar6);
  uVar4 = (uint)info->options;
LAB_0012708d:
  wsi->vhost = vhost;
  wsi->context = plVar2;
  wsi->protocol = (lws_protocols *)0x0;
  if ((~uVar4 & 0x1008) == 0) {
    (vhost->tls).allow_non_ssl_on_ssl_port = 1;
  }
  if ((vhost->tls).use_ssl != 0) {
    iVar5 = lws_tls_server_vhost_backend_init(info,vhost,wsi);
    if (iVar5 != 0) {
      return -1;
    }
    lws_tls_server_client_cert_verify_config(vhost);
    iVar5 = (*vhost->protocols->callback)
                      (wsi,LWS_CALLBACK_OPENSSL_LOAD_EXTRA_SERVER_VERIFY_CERTS,(vhost->tls).ssl_ctx,
                       vhost,0);
    if (iVar5 != 0) {
      return -1;
    }
    if ((vhost->tls).use_ssl != 0) {
      lws_context_init_alpn(vhost);
    }
  }
  plVar2->pt[0].sul_tls.cb = lws_sul_tls_cb;
  __lws_sul_insert(&plVar2->pt[0].pt_sul_owner,&plVar2->pt[0].sul_tls,86400000000);
  return 0;
}

Assistant:

int
lws_context_init_server_ssl(const struct lws_context_creation_info *info,
			    struct lws_vhost *vhost)
{
	struct lws_context *context = vhost->context;
	struct lws *wsi = context->pt[0].fake_wsi;

	if (!lws_check_opt(info->options,
			   LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT)) {
		vhost->tls.use_ssl = 0;

		return 0;
	}

	/*
	 * If he is giving a server cert, take it as a sign he wants to use
	 * it on this vhost.  User code can leave the cert filepath NULL and
	 * set the LWS_SERVER_OPTION_CREATE_VHOST_SSL_CTX option itself, in
	 * which case he's expected to set up the cert himself at
	 * LWS_CALLBACK_OPENSSL_LOAD_EXTRA_SERVER_VERIFY_CERTS, which
	 * provides the vhost SSL_CTX * in the user parameter.
	 */
	if (info->ssl_cert_filepath || info->server_ssl_cert_mem)
		vhost->options |= LWS_SERVER_OPTION_CREATE_VHOST_SSL_CTX;

	if (info->port != CONTEXT_PORT_NO_LISTEN) {

		vhost->tls.use_ssl = lws_check_opt(vhost->options,
					LWS_SERVER_OPTION_CREATE_VHOST_SSL_CTX);

		if (vhost->tls.use_ssl && info->ssl_cipher_list)
			lwsl_notice(" SSL ciphers: '%s'\n",
						info->ssl_cipher_list);

		lwsl_notice(" Vhost '%s' using %sTLS mode\n",
			    vhost->name, vhost->tls.use_ssl ? "" : "non-");
	}

	/*
	 * give him a fake wsi with context + vhost set, so he can use
	 * lws_get_context() in the callback
	 */
	wsi->vhost = vhost; /* not a real bound wsi */
	wsi->context = context;
	wsi->protocol = NULL;

	/*
	 * as a server, if we are requiring clients to identify themselves
	 * then set the backend up for it
	 */
	if (lws_check_opt(info->options,
			  LWS_SERVER_OPTION_ALLOW_NON_SSL_ON_SSL_PORT))
		/* Normally SSL listener rejects non-ssl, optionally allow */
		vhost->tls.allow_non_ssl_on_ssl_port = 1;

	/*
	 * give user code a chance to load certs into the server
	 * allowing it to verify incoming client certs
	 */
	if (vhost->tls.use_ssl) {
		if (lws_tls_server_vhost_backend_init(info, vhost, wsi))
			return -1;

		lws_tls_server_client_cert_verify_config(vhost);

		if (vhost->protocols[0].callback(wsi,
			    LWS_CALLBACK_OPENSSL_LOAD_EXTRA_SERVER_VERIFY_CERTS,
			    vhost->tls.ssl_ctx, vhost, 0))
			return -1;
	}

	if (vhost->tls.use_ssl)
		lws_context_init_alpn(vhost);

	/* check certs once a day */

	context->pt[0].sul_tls.cb = lws_sul_tls_cb;
	__lws_sul_insert(&context->pt[0].pt_sul_owner, &context->pt[0].sul_tls,
			 (lws_usec_t)24 * 3600 * LWS_US_PER_SEC);

	return 0;
}